

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureUtil.cpp
# Opt level: O0

bool glu::isGLInternalColorFormatFilterable(deUint32 format)

{
  bool local_9;
  deUint32 format_local;
  
  if ((((format == 0x8051) || (format - 0x8056 < 4)) || (format == 0x8229)) ||
     ((format == 0x822b || (format == 0x822d)))) {
LAB_01036d1a:
    local_9 = true;
  }
  else {
    if (format != 0x822e) {
      if (format == 0x822f) goto LAB_01036d1a;
      if ((0xc < format - 0x8230) && (1 < format - 0x8814)) {
        if (((format - 0x881a < 2) ||
            (((format == 0x8c3a || (format == 0x8c3d)) || (format == 0x8c41)))) ||
           ((format == 0x8c43 || (format == 0x8d62)))) goto LAB_01036d1a;
        if ((1 < format - 0x8d70) &&
           (((1 < format - 0x8d76 && (1 < format - 0x8d7c)) &&
            ((1 < format - 0x8d82 && ((1 < format - 0x8d88 && (1 < format - 0x8d8e)))))))) {
          if ((format - 0x8f94 < 4) || (format - 0x8fbd < 2)) goto LAB_01036d1a;
          if (format != 0x906f) {
            return false;
          }
        }
      }
    }
    local_9 = false;
  }
  return local_9;
}

Assistant:

bool isGLInternalColorFormatFilterable (deUint32 format)
{
	switch (format)
	{
		case GL_R8:
		case GL_R8_SNORM:
		case GL_RG8:
		case GL_RG8_SNORM:
		case GL_RGB8:
		case GL_RGB8_SNORM:
		case GL_RGB565:
		case GL_RGBA4:
		case GL_RGB5_A1:
		case GL_RGBA8:
		case GL_RGBA8_SNORM:
		case GL_RGB10_A2:
		case GL_SR8_EXT:
		case GL_SRG8_EXT:
		case GL_SRGB8:
		case GL_SRGB8_ALPHA8:
		case GL_R16F:
		case GL_RG16F:
		case GL_RGB16F:
		case GL_RGBA16F:
		case GL_R11F_G11F_B10F:
		case GL_RGB9_E5:
			return true;

		case GL_RGB10_A2UI:
		case GL_R32F:
		case GL_RG32F:
		case GL_RGB32F:
		case GL_RGBA32F:
		case GL_R8I:
		case GL_R8UI:
		case GL_R16I:
		case GL_R16UI:
		case GL_R32I:
		case GL_R32UI:
		case GL_RG8I:
		case GL_RG8UI:
		case GL_RG16I:
		case GL_RG16UI:
		case GL_RG32I:
		case GL_RG32UI:
		case GL_RGB8I:
		case GL_RGB8UI:
		case GL_RGB16I:
		case GL_RGB16UI:
		case GL_RGB32I:
		case GL_RGB32UI:
		case GL_RGBA8I:
		case GL_RGBA8UI:
		case GL_RGBA16I:
		case GL_RGBA16UI:
		case GL_RGBA32I:
		case GL_RGBA32UI:
			return false;

		default:
			DE_ASSERT(false);
			return false;
	}
}